

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O1

void __thiscall TPZPrInteg<TPZIntCube3D>::GetOrder(TPZPrInteg<TPZIntCube3D> *this,TPZVec<int> *ord)

{
  int *piVar1;
  
  if (ord->fNElements < 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n"
               ,0x54);
    return;
  }
  piVar1 = ord->fStore;
  *piVar1 = (this->super_TPZIntCube3D).fOrdKsi;
  piVar1[1] = (this->super_TPZIntCube3D).fOrdEta;
  piVar1[2] = (this->super_TPZIntCube3D).fOrdZeta;
  piVar1[3] = this->fOrdKsi;
  return;
}

Assistant:

void GetOrder(TPZVec<int> &ord) const override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::GetOrder(ord);
		ord[Dim-1] = fOrdKsi;
    }